

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O2

void __thiscall PropagationState::step(PropagationState *this)

{
  PcodeOp *pPVar1;
  Varnode *vn;
  _List_node_base *p_Var2;
  int4 iVar3;
  int iVar4;
  _Self __tmp;
  PcodeOp *pPVar5;
  
  iVar4 = this->slot + 1;
  this->slot = iVar4;
  pPVar1 = this->op;
  if ((int)((ulong)((long)(pPVar1->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pPVar1->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                         _M_impl.super__Vector_impl_data._M_start) >> 3) <= iVar4) {
    vn = this->vn;
    p_Var2 = (this->iter)._M_node;
    if (p_Var2 == (_List_node_base *)&vn->descend) {
      pPVar5 = (PcodeOp *)0x0;
      if (pPVar1 != vn->def) {
        pPVar5 = vn->def;
      }
      this->op = pPVar5;
      this->inslot = -1;
      this->slot = 0;
    }
    else {
      (this->iter)._M_node = p_Var2->_M_next;
      pPVar1 = (PcodeOp *)p_Var2[1]._M_next;
      this->op = pPVar1;
      this->slot = -(uint)(pPVar1->output != (Varnode *)0x0);
      iVar3 = PcodeOp::getSlot(pPVar1,vn);
      this->inslot = iVar3;
    }
  }
  return;
}

Assistant:

void PropagationState::step(void)

{
  slot += 1;
  if (slot < op->numInput())
    return;
  if (iter != vn->endDescend()) {
    op = *iter++;
    if (op->getOut() != (Varnode *)0)
      slot = -1;
    else
      slot = 0;
    inslot = op->getSlot(vn);
    return;
  }
  if (op == vn->getDef())
    op = (PcodeOp *)0;
  else
    op = vn->getDef();
  inslot = -1;
  slot = 0;
}